

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

baseHolder * __thiscall
cs_impl::any::holder<cs::range_type>::duplicate(holder<cs::range_type> *this)

{
  _func_int **pp_Var1;
  baseHolder *pbVar2;
  
  if ((DAT_00260658 == 0) || (cs::global_thread_counter != 0)) {
    pbVar2 = (baseHolder *)operator_new(0x70);
  }
  else {
    pbVar2 = *(baseHolder **)
              (&holder<std::shared_ptr<cs::name_space>>::allocator + DAT_00260658 * 8);
    DAT_00260658 = DAT_00260658 + -1;
  }
  pbVar2->_vptr_baseHolder = (_func_int **)&PTR__baseHolder_00255db0;
  pp_Var1 = *(_func_int ***)((long)&(this->mDat).m_start.data + 8);
  pbVar2[2]._vptr_baseHolder = (_func_int **)(this->mDat).m_start.data._int;
  pbVar2[3]._vptr_baseHolder = pp_Var1;
  *(bool *)&pbVar2[4]._vptr_baseHolder = (this->mDat).m_start.type;
  pp_Var1 = *(_func_int ***)((long)&(this->mDat).m_stop.data + 8);
  pbVar2[6]._vptr_baseHolder = (_func_int **)(this->mDat).m_stop.data._int;
  pbVar2[7]._vptr_baseHolder = pp_Var1;
  *(bool *)&pbVar2[8]._vptr_baseHolder = (this->mDat).m_stop.type;
  pp_Var1 = *(_func_int ***)((long)&(this->mDat).m_step.data + 8);
  pbVar2[10]._vptr_baseHolder = (_func_int **)(this->mDat).m_step.data._int;
  pbVar2[0xb]._vptr_baseHolder = pp_Var1;
  *(bool *)&pbVar2[0xc]._vptr_baseHolder = (this->mDat).m_step.type;
  return pbVar2;
}

Assistant:

baseHolder *duplicate() override
			{
				return allocator.alloc(mDat);
			}